

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::IfExpr::IfExpr(IfExpr *this,Location *loc)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  
  (this->super_ExprMixin<(wabt::ExprType)22>).super_Expr.super_intrusive_list_base<wabt::Expr>.next_
       = (Expr *)0x0;
  (this->super_ExprMixin<(wabt::ExprType)22>).super_Expr.super_intrusive_list_base<wabt::Expr>.prev_
       = (Expr *)0x0;
  (this->super_ExprMixin<(wabt::ExprType)22>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__Expr_001832b8;
  pcVar1 = (loc->filename)._M_str;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->super_ExprMixin<(wabt::ExprType)22>).super_Expr.loc.filename._M_len =
       (loc->filename)._M_len;
  (this->super_ExprMixin<(wabt::ExprType)22>).super_Expr.loc.filename._M_str = pcVar1;
  (this->super_ExprMixin<(wabt::ExprType)22>).super_Expr.loc.field_1.field_1.offset = sVar2;
  *(undefined8 *)((long)&(this->super_ExprMixin<(wabt::ExprType)22>).super_Expr.loc.field_1 + 8) =
       uVar3;
  (this->super_ExprMixin<(wabt::ExprType)22>).super_Expr.type_ = If;
  (this->super_ExprMixin<(wabt::ExprType)22>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__IfExpr_00183a18;
  Block::Block(&this->true_);
  (this->false_end_loc).filename._M_str = (char *)0x0;
  (this->false_end_loc).field_1.field_1.offset = 0;
  (this->false_).size_ = 0;
  (this->false_end_loc).filename._M_len = 0;
  (this->false_).first_ = (Expr *)0x0;
  (this->false_).last_ = (Expr *)0x0;
  (this->false_end_loc).field_1.field_0.last_column = 0;
  return;
}

Assistant:

explicit IfExpr(const Location& loc = Location())
      : ExprMixin<ExprType::If>(loc) {}